

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O1

int32 __thiscall rw::MaterialList::appendMaterial(MaterialList *this,Material *mat)

{
  long lVar1;
  int iVar2;
  Material **ppMVar3;
  
  iVar2 = this->space;
  if (iVar2 <= this->numMaterials) {
    lVar1 = (long)iVar2 * 8 + 0xa0;
    if (this->materials == (Material **)0x0) {
      allocLocation =
           "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geometry.cpp line: 744"
      ;
      ppMVar3 = (Material **)(*Engine::memfuncs)(lVar1,0x30007);
    }
    else {
      allocLocation =
           "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geometry.cpp line: 742"
      ;
      ppMVar3 = (Material **)(*DAT_00149dd8)(this->materials,lVar1,0x30007);
    }
    if (ppMVar3 == (Material **)0x0) {
      return -1;
    }
    this->space = iVar2 + 0x14;
    this->materials = ppMVar3;
  }
  iVar2 = this->numMaterials;
  this->numMaterials = iVar2 + 1;
  this->materials[iVar2] = mat;
  mat->refCount = mat->refCount + 1;
  return iVar2;
}

Assistant:

int32
MaterialList::appendMaterial(Material *mat)
{
	Material **ml;
	int32 space;
	if(this->numMaterials >= this->space){
		space = this->space + 20;
		if(this->materials)
			ml = rwReallocT(Material*, this->materials, space,
						MEMDUR_EVENT | ID_MATERIAL);
		else
			ml = rwMallocT(Material*, space, MEMDUR_EVENT | ID_MATERIAL);
		if(ml == nil)
			return -1;
		this->space = space;
		this->materials = ml;
	}
	this->materials[this->numMaterials++] = mat;
	mat->addRef();
	return this->numMaterials-1;
}